

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O0

void * sys_alloc(mstate m,size_t nb)

{
  char *oldbase_00;
  ulong uVar1;
  ulong uVar2;
  void *pvVar3;
  mchunkptr pmVar4;
  mchunkptr pmVar5;
  int *piVar6;
  bool bVar7;
  mchunkptr r;
  mchunkptr p;
  size_t rsize;
  char *oldbase;
  msegmentptr sp;
  mchunkptr mn;
  char *mp;
  size_t fp;
  void *mem;
  size_t asize;
  size_t sStack_30;
  flag_t mmap_flag;
  size_t tsize;
  char *tbase;
  size_t nb_local;
  mstate m_local;
  
  tsize = 0xffffffffffffffff;
  sStack_30 = 0;
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (((((m->mflags & 1) == 0) || (nb < mparams.mmap_threshold)) || (m->topsize == 0)) ||
     (m_local = (mstate)mmap_alloc(m,nb), m_local == (mstate)0x0)) {
    uVar1 = nb + mparams.granularity + 0x5f & (mparams.granularity - 1 ^ 0xffffffffffffffff);
    if (nb < uVar1) {
      if ((m->footprint_limit == 0) ||
         ((uVar2 = m->footprint + uVar1, m->footprint < uVar2 && (uVar2 <= m->footprint_limit)))) {
        pvVar3 = mmap((void *)0x0,uVar1,3,0x22,-1,0);
        if (pvVar3 != (void *)0xffffffffffffffff) {
          sStack_30 = uVar1;
          tsize = (size_t)pvVar3;
        }
        asize._4_4_ = (uint)(pvVar3 != (void *)0xffffffffffffffff);
        if (tsize != 0xffffffffffffffff) {
          uVar1 = sStack_30 + m->footprint;
          m->footprint = uVar1;
          if (m->max_footprint < uVar1) {
            m->max_footprint = m->footprint;
          }
          if (m->top == (mchunkptr)0x0) {
            if ((m->least_addr == (char *)0x0) || (tsize < m->least_addr)) {
              m->least_addr = (char *)tsize;
            }
            (m->seg).base = (char *)tsize;
            (m->seg).size = sStack_30;
            (m->seg).sflags = asize._4_4_;
            m->magic = mparams.magic;
            m->release_checks = 0xfff;
            init_bins(m);
            if (m == &_gm_) {
              init_top(&_gm_,(mchunkptr)tsize,sStack_30 - 0x50);
            }
            else {
              pmVar4 = (mchunkptr)((long)m->smallbins + ((m[-1].exts & 0xfffffffffffffff8) - 0x58));
              init_top(m,pmVar4,((tsize + sStack_30) - (long)pmVar4) - 0x50);
            }
          }
          else {
            oldbase = (char *)&m->seg;
            while( true ) {
              bVar7 = false;
              if (oldbase != (char *)0x0) {
                bVar7 = tsize != *(long *)oldbase + *(long *)(oldbase + 8);
              }
              if (!bVar7) break;
              oldbase = *(char **)(oldbase + 0x10);
            }
            if (((oldbase == (char *)0x0) || ((*(uint *)(oldbase + 0x18) & 8) != 0)) ||
               (((*(uint *)(oldbase + 0x18) & 1) != asize._4_4_ ||
                ((m->top < *(mchunkptr *)oldbase ||
                 ((mchunkptr)(*(long *)oldbase + *(long *)(oldbase + 8)) <= m->top)))))) {
              if (tsize < m->least_addr) {
                m->least_addr = (char *)tsize;
              }
              oldbase = (char *)&m->seg;
              while( true ) {
                bVar7 = false;
                if (oldbase != (char *)0x0) {
                  bVar7 = *(long *)oldbase != tsize + sStack_30;
                }
                if (!bVar7) break;
                oldbase = *(char **)(oldbase + 0x10);
              }
              if (((oldbase != (char *)0x0) && ((*(uint *)(oldbase + 0x18) & 8) == 0)) &&
                 ((*(uint *)(oldbase + 0x18) & 1) == asize._4_4_)) {
                oldbase_00 = *(char **)oldbase;
                *(size_t *)oldbase = tsize;
                *(size_t *)(oldbase + 8) = sStack_30 + *(long *)(oldbase + 8);
                pvVar3 = prepend_alloc(m,(char *)tsize,oldbase_00,nb);
                return pvVar3;
              }
              add_segment(m,(char *)tsize,sStack_30,asize._4_4_);
            }
            else {
              *(size_t *)(oldbase + 8) = sStack_30 + *(long *)(oldbase + 8);
              init_top(m,m->top,m->topsize + sStack_30);
            }
          }
          if (nb < m->topsize) {
            uVar1 = m->topsize - nb;
            m->topsize = uVar1;
            pmVar4 = m->top;
            pmVar5 = (mchunkptr)((long)&pmVar4->prev_foot + nb);
            m->top = pmVar5;
            pmVar5->head = uVar1 | 1;
            pmVar4->head = nb | 3;
            return &pmVar4->fd;
          }
        }
        piVar6 = __errno_location();
        *piVar6 = 0xc;
        m_local = (mstate)0x0;
      }
      else {
        m_local = (mstate)0x0;
      }
    }
    else {
      m_local = (mstate)0x0;
    }
  }
  return m_local;
}

Assistant:

static void* sys_alloc(mstate m, size_t nb) {
  char* tbase = CMFAIL;
  size_t tsize = 0;
  flag_t mmap_flag = 0;
  size_t asize; /* allocation size */

  ensure_initialization();

  /* Directly map large chunks, but only if already initialized */
  if (use_mmap(m) && nb >= mparams.mmap_threshold && m->topsize != 0) {
    void* mem = mmap_alloc(m, nb);
    if (mem != 0)
      return mem;
  }

  asize = granularity_align(nb + SYS_ALLOC_PADDING);
  if (asize <= nb)
    return 0; /* wraparound */
  if (m->footprint_limit != 0) {
    size_t fp = m->footprint + asize;
    if (fp <= m->footprint || fp > m->footprint_limit)
      return 0;
  }

  /*
    Try getting memory in any of three ways (in most-preferred to
    least-preferred order):
    1. A call to MORECORE that can normally contiguously extend memory.
       (disabled if not MORECORE_CONTIGUOUS or not HAVE_MORECORE or
       or main space is mmapped or a previous contiguous call failed)
    2. A call to MMAP new space (disabled if not HAVE_MMAP).
       Note that under the default settings, if MORECORE is unable to
       fulfill a request, and HAVE_MMAP is true, then mmap is
       used as a noncontiguous system allocator. This is a useful backup
       strategy for systems with holes in address spaces -- in this case
       sbrk cannot contiguously expand the heap, but mmap may be able to
       find space.
    3. A call to MORECORE that cannot usually contiguously extend memory.
       (disabled if not HAVE_MORECORE)

   In all cases, we need to request enough bytes from system to ensure
   we can malloc nb bytes upon success, so pad with enough space for
   top_foot, plus alignment-pad to make sure we don't lose bytes if
   not on boundary, and round this up to a granularity unit.
  */

  if (MORECORE_CONTIGUOUS && !use_noncontiguous(m)) {
    char* br = CMFAIL;
    size_t ssize = asize; /* sbrk call size */
    msegmentptr ss = (m->top == 0)? 0 : segment_holding(m, (char*)m->top);
    ACQUIRE_MALLOC_GLOBAL_LOCK();

    if (ss == 0) {  /* First time through or recovery */
      char* base = (char*)CALL_MORECORE(0);
      if (base != CMFAIL) {
        size_t fp;
        /* Adjust to end on a page boundary */
        if (!is_page_aligned(base))
          ssize += (page_align((size_t)base) - (size_t)base);
        fp = m->footprint + ssize; /* recheck limits */
        if (ssize > nb && ssize < HALF_MAX_SIZE_T &&
            (m->footprint_limit == 0 ||
             (fp > m->footprint && fp <= m->footprint_limit)) &&
            (br = (char*)(CALL_MORECORE(ssize))) == base) {
          tbase = base;
          tsize = ssize;
        }
      }
    }
    else {
      /* Subtract out existing available top space from MORECORE request. */
      ssize = granularity_align(nb - m->topsize + SYS_ALLOC_PADDING);
      /* Use mem here only if it did continuously extend old space */
      if (ssize < HALF_MAX_SIZE_T &&
          (br = (char*)(CALL_MORECORE(ssize))) == ss->base+ss->size) {
        tbase = br;
        tsize = ssize;
      }
    }

    if (tbase == CMFAIL) {    /* Cope with partial failure */
      if (br != CMFAIL) {    /* Try to use/extend the space we did get */
        if (ssize < HALF_MAX_SIZE_T &&
            ssize < nb + SYS_ALLOC_PADDING) {
          size_t esize = granularity_align(nb + SYS_ALLOC_PADDING - ssize);
          if (esize < HALF_MAX_SIZE_T) {
            char* end = (char*)CALL_MORECORE(esize);
            if (end != CMFAIL)
              ssize += esize;
            else {            /* Can't use; try to release */
              (void) CALL_MORECORE(-ssize);
              br = CMFAIL;
            }
          }
        }
      }
      if (br != CMFAIL) {    /* Use the space we did get */
        tbase = br;
        tsize = ssize;
      }
      else
        disable_contiguous(m); /* Don't try contiguous path in the future */
    }

    RELEASE_MALLOC_GLOBAL_LOCK();
  }

  if (HAVE_MMAP && tbase == CMFAIL) {  /* Try MMAP */
    char* mp = (char*)(CALL_MMAP(asize));
    if (mp != CMFAIL) {
      tbase = mp;
      tsize = asize;
      mmap_flag = USE_MMAP_BIT;
    }
  }

  if (HAVE_MORECORE && tbase == CMFAIL) { /* Try noncontiguous MORECORE */
    if (asize < HALF_MAX_SIZE_T) {
      char* br = CMFAIL;
      char* end = CMFAIL;
      ACQUIRE_MALLOC_GLOBAL_LOCK();
      br = (char*)(CALL_MORECORE(asize));
      end = (char*)(CALL_MORECORE(0));
      RELEASE_MALLOC_GLOBAL_LOCK();
      if (br != CMFAIL && end != CMFAIL && br < end) {
        size_t ssize = end - br;
        if (ssize > nb + TOP_FOOT_SIZE) {
          tbase = br;
          tsize = ssize;
        }
      }
    }
  }

  if (tbase != CMFAIL) {

    if ((m->footprint += tsize) > m->max_footprint)
      m->max_footprint = m->footprint;

    if (!is_initialized(m)) { /* first-time initialization */
      if (m->least_addr == 0 || tbase < m->least_addr)
        m->least_addr = tbase;
      m->seg.base = tbase;
      m->seg.size = tsize;
      m->seg.sflags = mmap_flag;
      m->magic = mparams.magic;
      m->release_checks = MAX_RELEASE_CHECK_RATE;
      init_bins(m);
#if !ONLY_MSPACES
      if (is_global(m))
        init_top(m, (mchunkptr)tbase, tsize - TOP_FOOT_SIZE);
      else
#endif
      {
        /* Offset top by embedded malloc_state */
        mchunkptr mn = next_chunk(mem2chunk(m));
        init_top(m, mn, (size_t)((tbase + tsize) - (char*)mn) -TOP_FOOT_SIZE);
      }
    }

    else {
      /* Try to merge with an existing segment */
      msegmentptr sp = &m->seg;
      /* Only consider most recent segment if traversal suppressed */
      while (sp != 0 && tbase != sp->base + sp->size)
        sp = (NO_SEGMENT_TRAVERSAL) ? 0 : sp->next;
      if (sp != 0 &&
          !is_extern_segment(sp) &&
          (sp->sflags & USE_MMAP_BIT) == mmap_flag &&
          segment_holds(sp, m->top)) { /* append */
        sp->size += tsize;
        init_top(m, m->top, m->topsize + tsize);
      }
      else {
        if (tbase < m->least_addr)
          m->least_addr = tbase;
        sp = &m->seg;
        while (sp != 0 && sp->base != tbase + tsize)
          sp = (NO_SEGMENT_TRAVERSAL) ? 0 : sp->next;
        if (sp != 0 &&
            !is_extern_segment(sp) &&
            (sp->sflags & USE_MMAP_BIT) == mmap_flag) {
          char* oldbase = sp->base;
          sp->base = tbase;
          sp->size += tsize;
          return prepend_alloc(m, tbase, oldbase, nb);
        }
        else
          add_segment(m, tbase, tsize, mmap_flag);
      }
    }

    if (nb < m->topsize) { /* Allocate from new or extended top space */
      size_t rsize = m->topsize -= nb;
      mchunkptr p = m->top;
      mchunkptr r = m->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(m, p, nb);
      check_top_chunk(m, m->top);
      check_malloced_chunk(m, chunk2mem(p), nb);
      return chunk2mem(p);
    }
  }

  MALLOC_FAILURE_ACTION;
  return 0;
}